

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O0

string_view __thiscall RenX::Server::getPrefix(Server *this)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *msg;
  __sv_type _Var2;
  string_view sVar3;
  Server *this_local;
  
  if (getPrefix()::parsed_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&getPrefix()::parsed_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&getPrefix()::parsed_abi_cxx11_);
      __cxa_atexit(std::__cxx11::string::~string,&getPrefix()::parsed_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&getPrefix()::parsed_abi_cxx11_);
    }
  }
  msg = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&getPrefix()::parsed_abi_cxx11_,&this->m_IRCPrefix);
  processTags(msg,this,(PlayerInfo *)0x0,(PlayerInfo *)0x0,(BuildingInfo *)0x0);
  _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&getPrefix()::parsed_abi_cxx11_);
  sVar3._M_len = _Var2._M_len;
  sVar3._M_str = _Var2._M_str;
  return sVar3;
}

Assistant:

std::string_view RenX::Server::getPrefix() const {
	static std::string parsed; // TODO: What the hell?
	RenX::processTags(parsed = m_IRCPrefix, this);
	return parsed;
}